

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<long_double>_>::MultAdd
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *x,
          TPZFMatrix<Fad<long_double>_> *y,TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *alpha,
          Fad<long_double> *beta,int opt)

{
  TPZFMatrix<Fad<long_double>_> *pTVar1;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *pFVar2;
  int64_t iVar3;
  int64_t iVar4;
  Fad<long_double> *v;
  Fad<long_double> *pFVar5;
  TPZFMatrix<Fad<long_double>_> *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  Fad<long_double> *in_R9;
  int in_stack_00000008;
  Fad<long_double> val;
  int64_t r;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  int64_t cols;
  int64_t rows;
  Fad<long_double> *in_stack_fffffffffffffd60;
  Fad<long_double> *in_stack_fffffffffffffd68;
  long lVar6;
  Fad<long_double> *in_stack_fffffffffffffd70;
  TPZBaseMatrix *fadexpr;
  TPZFMatrix<Fad<long_double>_> *this_00;
  Fad<long_double> *in_stack_fffffffffffffd90;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *in_stack_fffffffffffffda8;
  undefined1 local_228 [48];
  undefined1 local_1f8 [12];
  int in_stack_fffffffffffffe14;
  Fad<long_double> *in_stack_fffffffffffffe18;
  TPZFMatrix<Fad<long_double>_> *in_stack_fffffffffffffe20;
  TPZFMatrix<Fad<long_double>_> *in_stack_fffffffffffffe28;
  TPZMatrix<Fad<long_double>_> *in_stack_fffffffffffffe30;
  undefined1 local_1c8 [72];
  undefined8 local_180;
  undefined1 local_178 [48];
  undefined1 local_148 [104];
  undefined8 local_e0;
  undefined1 local_d8 [48];
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_98 [3];
  Fad<long_double> *local_60;
  long local_58;
  long local_50;
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  TPZFMatrix<Fad<long_double>_> *local_20;
  TPZBaseMatrix *local_18;
  TPZBaseMatrix *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_stack_00000008 == 0) {
    in_stack_fffffffffffffda8 =
         (FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)TPZBaseMatrix::Cols(in_RDI);
    pFVar2 = (FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
             TPZBaseMatrix::Rows(local_10);
    if (in_stack_fffffffffffffda8 == pFVar2) goto LAB_01340a18;
LAB_01340a41:
    Error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
LAB_01340a18:
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    iVar4 = TPZBaseMatrix::Rows(local_10);
    if (iVar3 != iVar4) goto LAB_01340a41;
  }
  v = (Fad<long_double> *)TPZBaseMatrix::Cols(local_10);
  pFVar5 = (Fad<long_double> *)TPZBaseMatrix::Cols(local_18);
  if (v == pFVar5) {
    in_stack_fffffffffffffd90 = (Fad<long_double> *)TPZBaseMatrix::Rows(local_10);
    pFVar5 = (Fad<long_double> *)TPZBaseMatrix::Rows(local_18);
    if (in_stack_fffffffffffffd90 == pFVar5) goto LAB_01340ab9;
  }
  Error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
LAB_01340ab9:
  local_38 = TPZBaseMatrix::Rows(in_RDI);
  local_40 = TPZBaseMatrix::Cols(in_RDI);
  local_48 = TPZBaseMatrix::Cols(local_10);
  pFVar2 = local_98;
  this_00 = local_20;
  Fad<long_double>::Fad(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  PrepareZ(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
           in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
  Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
  local_e0 = 0;
  Fad<long_double>::Fad<double,_nullptr>
            (in_stack_fffffffffffffd70,(double *)in_stack_fffffffffffffd68);
  fadexpr = local_18;
  for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
    if (in_stack_00000008 == 0) {
      for (local_58 = 0; local_58 < local_40; local_58 = local_58 + 1) {
        for (local_60 = (Fad<long_double> *)0x0; (long)local_60 < local_38;
            local_60 = (Fad<long_double> *)((long)&local_60->val_ + 1)) {
          in_stack_fffffffffffffd70 =
               TPZFMatrix<Fad<long_double>_>::operator()
                         (this_00,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffffd70);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_148,in_RDI,local_60,local_58);
          operator*<Fad<long_double>,_Fad<long_double>,_nullptr>(v,in_stack_fffffffffffffd90);
          (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_178,local_10,local_58,local_50);
          operator*<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>,_nullptr>
                    ((FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)v,
                     in_stack_fffffffffffffd90);
          operator+<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_nullptr>
                    (v,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
                        *)in_stack_fffffffffffffd90);
          Fad<long_double>::operator=
                    ((Fad<long_double> *)this_00,
                     (FadExpr<FadBinaryAdd<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>
                      *)fadexpr);
          FadExpr<FadBinaryAdd<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryAdd<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>
                      *)in_stack_fffffffffffffd60);
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
          ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>
                      *)in_stack_fffffffffffffd60);
          Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
          FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
                     in_stack_fffffffffffffd60);
          Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
          (*(local_20->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(local_20,local_60,local_50,local_d8);
        }
      }
    }
    else {
      for (local_60 = (Fad<long_double> *)0x0; (long)local_60 < local_38;
          local_60 = (Fad<long_double> *)((long)&local_60->val_ + 1)) {
        local_180 = 0;
        Fad<long_double>::operator=<double,_nullptr>((Fad<long_double> *)this_00,(double *)fadexpr);
        for (local_58 = 0; pTVar1 = local_20, local_58 < local_40; local_58 = local_58 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1c8,in_RDI,local_58,local_60);
          (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_1f8,local_10,local_58,local_50);
          operator*<Fad<long_double>,_Fad<long_double>,_nullptr>(v,in_stack_fffffffffffffd90);
          Fad<long_double>::operator+=(in_stack_fffffffffffffd90,pFVar2);
          FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
                     in_stack_fffffffffffffd60);
          Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
          Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
        }
        in_stack_fffffffffffffd60 = local_60;
        lVar6 = local_50;
        operator*<Fad<long_double>,_Fad<long_double>,_nullptr>(v,in_stack_fffffffffffffd90);
        Fad<long_double>::Fad<FadBinaryMul<Fad<long_double>,Fad<long_double>>>
                  (in_R9,in_stack_fffffffffffffda8);
        (*(pTVar1->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(pTVar1,in_stack_fffffffffffffd60,lVar6,local_228);
        Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
        FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
                   in_stack_fffffffffffffd60);
      }
    }
  }
  Fad<long_double>::~Fad(in_stack_fffffffffffffd60);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}